

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  int in_EAX;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  
  do {
    lVar6 = (long)end - (long)ptr;
    if (lVar6 < 2) {
      return -1;
    }
    bVar1 = *ptr;
    if (bVar1 < 0xdc) {
      uVar5 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
        }
        else {
LAB_0040fa5e:
          uVar5 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar5 = 8;
    }
    else if ((bVar1 != 0xff) || (uVar5 = 0, ((byte *)ptr)[1] < 0xfe)) goto LAB_0040fa5e;
    switch(uVar5) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = ptr;
      in_EAX = 0;
      break;
    default:
      pbVar3 = (byte *)ptr + 2;
      goto LAB_0040faed;
    case 6:
      if (lVar6 != 2) {
        pbVar3 = (byte *)ptr + 3;
        goto LAB_0040faed;
      }
LAB_0040fad9:
      in_EAX = -2;
      bVar2 = false;
      pbVar3 = (byte *)ptr;
      goto LAB_0040faf2;
    case 7:
      if (lVar6 < 4) goto LAB_0040fad9;
      pbVar3 = (byte *)ptr + 4;
LAB_0040faed:
      bVar2 = true;
      goto LAB_0040faf2;
    case 0xc:
    case 0xd:
      pbVar3 = (byte *)ptr + 2;
      bVar2 = true;
      if (uVar5 != open) goto LAB_0040faf2;
      if ((long)end - (long)pbVar3 < 2) {
        in_EAX = -0x1b;
        ptr = (char *)pbVar3;
      }
      else {
        *nextTokPtr = (char *)pbVar3;
        bVar1 = *pbVar3;
        if (bVar1 < 0xdc) {
          bVar4 = 7;
          if (3 < bVar1 - 0xd8) {
            if (bVar1 == 0) {
              bVar4 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
            }
            else {
LAB_0040fb1f:
              bVar4 = 0x1d;
            }
          }
        }
        else if (bVar1 - 0xdc < 4) {
          bVar4 = 8;
        }
        else {
          if ((bVar1 != 0xff) || (((byte *)ptr)[3] < 0xfe)) goto LAB_0040fb1f;
          bVar4 = 0;
        }
        ptr = (char *)pbVar3;
        in_EAX = 0;
        if ((bVar4 < 0x1f) && (in_EAX = 0, (0x40300e00U >> (bVar4 & 0x1f) & 1) != 0)) {
          in_EAX = 0x1b;
        }
      }
    }
    bVar2 = false;
    pbVar3 = (byte *)ptr;
LAB_0040faf2:
    ptr = (char *)pbVar3;
    if (!bVar2) {
      return in_EAX;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}